

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

int64_t get_satd(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  long lVar3;
  int row;
  int col;
  int iVar4;
  int iVar5;
  int iVar6;
  
  uVar2 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [cpi->weber_bsize];
  iVar5 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar2]
          + mi_row;
  lVar3 = 0;
  iVar6 = 0;
  iVar4 = mi_col;
  do {
    if ((mi_row < (cpi->common).mi_params.mi_rows) && (iVar4 < (cpi->common).mi_params.mi_cols)) {
      lVar3 = lVar3 + cpi->mb_weber_stats
                      [iVar4 / (int)(uint)bVar1 +
                       (mi_row / (int)(uint)bVar1) * (cpi->frame_info).mi_cols].satd;
      iVar6 = iVar6 + 1;
    }
    iVar4 = iVar4 + (uint)bVar1;
  } while ((iVar4 < (int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [uVar2] + mi_col)) ||
          (mi_row = mi_row + (uint)bVar1, iVar4 = mi_col, mi_row < iVar5));
  if (iVar6 != 0) {
    lVar3 = (long)(int)(lVar3 / (long)iVar6);
  }
  iVar4 = 1;
  if (1 < lVar3) {
    iVar4 = (int)lVar3;
  }
  return (long)iVar4;
}

Assistant:

static int64_t get_satd(AV1_COMP *const cpi, BLOCK_SIZE bsize, int mi_row,
                        int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  int64_t satd = 0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      satd += cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)]
                  .satd;
      ++mb_count;
    }
  }

  if (mb_count) satd = (int)(satd / mb_count);
  satd = AOMMAX(1, satd);

  return (int)satd;
}